

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPMuxError ChunkSetHead(WebPChunk *chunk,WebPChunk **chunk_list)

{
  uint8_t *puVar1;
  int iVar2;
  WebPMuxError WVar3;
  WebPChunk *pWVar4;
  
  if (*chunk_list != (WebPChunk *)0x0) {
    return WEBP_MUX_NOT_FOUND;
  }
  pWVar4 = (WebPChunk *)WebPSafeMalloc(1,0x20);
  if (pWVar4 == (WebPChunk *)0x0) {
    WVar3 = WEBP_MUX_MEMORY_ERROR;
  }
  else {
    (pWVar4->data_).size = (chunk->data_).size;
    iVar2 = chunk->owner_;
    puVar1 = (chunk->data_).bytes;
    pWVar4->tag_ = chunk->tag_;
    pWVar4->owner_ = iVar2;
    (pWVar4->data_).bytes = puVar1;
    chunk->owner_ = 0;
    pWVar4->next_ = (WebPChunk *)0x0;
    *chunk_list = pWVar4;
    WVar3 = WEBP_MUX_OK;
  }
  return WVar3;
}

Assistant:

WebPMuxError ChunkSetHead(WebPChunk* const chunk,
                          WebPChunk** const chunk_list) {
  WebPChunk* new_chunk;

  assert(chunk_list != NULL);
  if (*chunk_list != NULL) {
    return WEBP_MUX_NOT_FOUND;
  }

  new_chunk = (WebPChunk*)WebPSafeMalloc(1ULL, sizeof(*new_chunk));
  if (new_chunk == NULL) return WEBP_MUX_MEMORY_ERROR;
  *new_chunk = *chunk;
  chunk->owner_ = 0;
  new_chunk->next_ = NULL;
  *chunk_list = new_chunk;
  return WEBP_MUX_OK;
}